

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void TestSplitOnBorder(void)

{
  size_type sVar1;
  size_type sVar2;
  char *pcVar3;
  size_t bytes;
  ostream *poVar4;
  streamsize *this;
  istream *this_00;
  OutputBuffer *this_01;
  InputBuffer *this_02;
  OutputBuffer buf;
  OutputBuffer newBuf;
  size_t firstChunkSize;
  char *local_300;
  InputBuffer local_2f8;
  undefined8 *local_2e8;
  char *local_2e0;
  size_t in;
  long local_2d0;
  undefined8 local_2c8;
  string part2;
  string part1;
  char *local_280;
  char *local_278;
  const_string local_270;
  const_string local_260;
  char *local_250;
  char *local_248;
  const_string local_240;
  const_string local_230;
  char *local_220;
  char *local_218;
  const_string local_210;
  const_string local_200;
  char *local_1f0;
  char *local_1e8;
  const_string local_1e0;
  const_string local_1d0;
  istream is;
  
  part1._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  part1._M_string_length =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + 0x6d;
  part1.field_2._M_allocated_capacity = 0x308;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&part1);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  part2._M_dataplus._M_p._0_1_ = 1;
  is.super_istream._M_gcount._0_1_ = 0;
  is.super_istream._vptr_basic_istream = (_func_int **)&PTR__lazy_ostream_001eac08;
  is.super_istream._16_8_ = &boost::unit_test::lazy_ostream::inst;
  is.super_istream._24_8_ = anon_var_dwarf_90faf;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&part2,(lazy_ostream *)&is);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&part2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&part1,"This message",(allocator<char> *)&is);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&part2," is to be split",(allocator<char> *)&is);
  avro::OutputBuffer::OutputBuffer(&buf,0);
  avro::detail::BufferImpl::writeTo(buf.pimpl_.px,part1._M_dataplus._M_p,part1._M_string_length);
  firstChunkSize = (buf.pimpl_.px)->size_;
  avro::OutputBuffer::OutputBuffer((OutputBuffer *)&is,0);
  avro::detail::BufferImpl::writeTo
            ((BufferImpl *)is.super_istream._vptr_basic_istream,
             (data_type *)CONCAT71(part2._M_dataplus._M_p._1_7_,part2._M_dataplus._M_p._0_1_),
             part2._M_string_length);
  avro::OutputBuffer::append<avro::OutputBuffer>(&buf,(OutputBuffer *)&is);
  avro::InputBuffer::InputBuffer(&local_2f8,&buf);
  printBuffer(&local_2f8);
  boost::detail::shared_count::~shared_count(&local_2f8.pimpl_.pn);
  this = &is.super_istream._M_gcount;
  boost::detail::shared_count::~shared_count((shared_count *)this);
  local_1d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1d0.m_end = "";
  local_1e0.m_begin = "";
  local_1e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_1d0,0x319,&local_1e0);
  is.super_istream._M_gcount._0_1_ = 0;
  is.super_istream._vptr_basic_istream = (_func_int **)&PTR__lazy_ostream_001ea848;
  is.super_istream._16_8_ = &boost::unit_test::lazy_ostream::inst;
  is.super_istream._24_8_ = (long)"\t" + 1;
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1e8 = "";
  sVar2 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(buf.pimpl_.px)->readChunks_);
  local_2f8.pimpl_.px = (element_type *)CONCAT44(local_2f8.pimpl_.px._4_4_,(int)sVar2);
  newBuf.pimpl_.px._0_4_ = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&is,&local_1f0,0x319,1,2,&local_2f8,"buf.numDataChunks()",&newBuf,"2");
  sVar1 = (buf.pimpl_.px)->size_;
  pcVar3 = (char *)operator_new__(firstChunkSize);
  local_300 = pcVar3;
  avro::istream::istream(&is,&buf);
  this_00 = &is;
  in = std::istream::readsome((char *)this_00,(long)pcVar3);
  local_200.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_200.m_end = "";
  local_210.m_begin = "";
  local_210.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_200,799,&local_210);
  local_2f8.pimpl_.pn.pi_._0_1_ = 0;
  local_2f8.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = "";
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_218 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_2f8,&local_220,799,1,2,&in,"in",&firstChunkSize,"firstChunkSize");
  avro::OutputBuffer::OutputBuffer(&newBuf,0);
  avro::OutputBuffer::append<avro::InputBuffer>(&newBuf,(InputBuffer *)&is.super_istream.field_0x50)
  ;
  bytes = std::istream::tellg();
  this_01 = &newBuf;
  avro::OutputBuffer::discardData(this_01,bytes);
  local_230.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_230.m_end = "";
  local_240.m_begin = "";
  local_240.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_01,&local_230,0x324,&local_240);
  this_02 = &local_2f8;
  local_2f8.pimpl_.pn.pi_._0_1_ = 0;
  local_2f8.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = "";
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_248 = "";
  sVar2 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    ((deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *)
                     CONCAT44(newBuf.pimpl_.px._4_4_,newBuf.pimpl_.px._0_4_));
  local_2c8 = CONCAT44(local_2c8._4_4_,(int)sVar2);
  local_2d0 = CONCAT44(local_2d0._4_4_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (this_02,&local_250,0x324,1,2,&local_2c8,"newBuf.numDataChunks()",&local_2d0,"1");
  pcVar3 = local_300;
  local_260.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_260.m_end = "";
  local_270.m_begin = "";
  local_270.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_02,&local_260,0x326,&local_270);
  local_2f8.pimpl_.pn.pi_._0_1_ = 0;
  local_2f8.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = "";
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_278 = "";
  local_2c8 = *(undefined8 *)(CONCAT44(newBuf.pimpl_.px._4_4_,newBuf.pimpl_.px._0_4_) + 0xa8);
  local_2d0 = sVar1 - in;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_2f8,&local_280,0x326,1,2,&local_2c8,"newBuf.size()",&local_2d0,"bufsize - in");
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (&std::cout,
                      *(streambuf **)
                       (&is.super_istream.field_0xe8 +
                       (long)is.super_istream._vptr_basic_istream[-3]));
  std::endl<char,std::char_traits<char>>(poVar4);
  avro::InputBuffer::InputBuffer(&local_2f8,&newBuf);
  printBuffer(&local_2f8);
  boost::detail::shared_count::~shared_count(&local_2f8.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&newBuf.pimpl_.pn);
  avro::istream::~istream(&is);
  boost::checked_array_delete<char>(pcVar3);
  boost::detail::shared_count::~shared_count(&buf.pimpl_.pn);
  std::__cxx11::string::~string((string *)&part2);
  std::__cxx11::string::~string((string *)&part1);
  return;
}

Assistant:

void TestSplitOnBorder()
{
    BOOST_TEST_MESSAGE( "TestSplitOnBorder");
    {

        const std::string part1 = "This message";
        const std::string part2 = " is to be split";

        avro::OutputBuffer buf;
        buf.writeTo(part1.c_str(), part1.size()); 
        size_t firstChunkSize = buf.size();

        {
            avro::OutputBuffer tmp;
            tmp.writeTo(part2.c_str(), part2.size()); 
            buf.append(tmp);
            printBuffer(InputBuffer(buf));
        }

        BOOST_CHECK_EQUAL(buf.numDataChunks(), 2);
        size_t bufsize = buf.size();
    
        boost::scoped_array<char> datain(new char[firstChunkSize]);
        avro::istream is(buf);
        size_t in = static_cast<size_t>(is.readsome(&datain[0], firstChunkSize));
        BOOST_CHECK_EQUAL(in, firstChunkSize);

        OutputBuffer newBuf;
        newBuf.append(is.getBuffer());
        newBuf.discardData(static_cast<size_t>(is.tellg()));
        BOOST_CHECK_EQUAL(newBuf.numDataChunks(), 1);

        BOOST_CHECK_EQUAL(newBuf.size(), bufsize - in);

        cout << is.rdbuf() << endl;
        printBuffer(newBuf);
    }
}